

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTraits.h
# Opt level: O0

string_view slang::typeName<std::__cxx11::string>(void)

{
  size_t __pos;
  size_t __n;
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t suffixLength;
  size_t prefixLength;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> *this;
  
  sVar1 = detail::wrappedTypeName<std::__cxx11::string>();
  this = (basic_string_view<char,_std::char_traits<char>_> *)sVar1._M_len;
  __pos = detail::wrappedTypeNamePrefixLength();
  __n = detail::wrappedTypeNameSuffixLength();
  std::basic_string_view<char,_std::char_traits<char>_>::length
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr(this,__pos,__n);
  sVar1._M_len = bVar2._M_len;
  sVar1._M_str = bVar2._M_str;
  return sVar1;
}

Assistant:

constexpr std::string_view typeName() {
    // https://stackoverflow.com/questions/81870/is-it-possible-to-print-a-variables-type-in-standard-c/64490578#64490578
    auto name = detail::wrappedTypeName<T>();
    auto prefixLength = detail::wrappedTypeNamePrefixLength();
    auto suffixLength = detail::wrappedTypeNameSuffixLength();
    return name.substr(prefixLength, name.length() - prefixLength - suffixLength);
}